

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

int Acb_NtkWindow2Solver
              (sat_solver *pSat,Cnf_Dat_t *pCnf,Vec_Int_t *vFlip,int PivotVar,int nDivs,int nTimes)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  sat_solver *s;
  int iVar7;
  uint uVar8;
  long lVar9;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  Vec_Int_t *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  sat_solver *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_60 = CONCAT44(local_60._4_4_,**pCnf->pClauses);
  uVar8 = nTimes - 1;
  uVar1 = nTimes;
  if (nTimes < 3) {
    uVar1 = uVar8;
  }
  local_70 = vFlip;
  iVar2 = sat_solver_nvars(pSat);
  if (iVar2 != 0) {
    __assert_fail("sat_solver_nvars(pSat) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x12f,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  uVar5 = 2;
  if (nTimes < 3) {
    uVar5 = uVar8;
  }
  local_50 = pSat;
  sat_solver_setnvars(pSat,uVar5 * nDivs + pCnf->nVars * nTimes + 2);
  if ((1 < uVar8) && (nTimes != 6)) {
    __assert_fail("nTimes == 1 || nTimes == 2 || nTimes == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x131,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  local_58 = CONCAT44(local_58._4_4_,1 - nTimes);
  uVar5 = 0;
  do {
    if ((uVar5 & 1) != 0) {
      Cnf_DataLiftAndFlipLits(pCnf,-pCnf->nVars,local_70);
    }
    if (0 < pCnf->nClauses) {
      lVar9 = 0;
      do {
        iVar2 = sat_solver_addclause(local_50,pCnf->pClauses[lVar9],pCnf->pClauses[lVar9 + 1]);
        if (iVar2 == 0) {
          puts("Error: SAT solver became UNSAT at a wrong place.");
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pCnf->nClauses);
    }
    if ((uVar5 & 1) != 0) {
      Cnf_DataLiftAndFlipLits(pCnf,pCnf->nVars,local_70);
    }
    if ((int)uVar5 < (int)uVar8) {
      iVar2 = pCnf->nVars;
LAB_0037a06c:
      Cnf_DataLift(pCnf,iVar2);
    }
    else if (uVar5 != 0) {
      iVar2 = pCnf->nVars * (int)local_58;
      goto LAB_0037a06c;
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == nTimes) {
      if ((int)local_60 != **pCnf->pClauses) {
        __assert_fail("Test == pCnf->pClauses[0][0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x140,
                      "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      s = local_50;
      if (0 < (int)uVar1) {
        local_80 = 0;
        local_44 = 0;
        local_40 = (ulong)(uint)nTimes;
        do {
          uVar8 = local_44 + 1;
          local_68 = (ulong)uVar8 % (local_40 & 0xffffffff);
          iVar2 = 0;
          if ((local_44 & 1) != 0) {
            iVar2 = nDivs;
          }
          if (0 < nDivs) {
            iVar4 = pCnf->nVars;
            local_68 = (ulong)(uint)((int)local_68 * iVar4);
            uVar6 = local_44 * iVar4;
            uVar5 = iVar4 * (int)local_40 + iVar2;
            iVar7 = uVar5 * 2 + 1;
            iVar4 = iVar4 * local_80;
            uVar3 = 0;
            iVar2 = nDivs;
            local_44 = uVar8;
            do {
              s = local_50;
              uVar8 = (int)uVar3 + (int)local_68;
              if ((int)(uVar8 | uVar6 | uVar5) < 0) {
                __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarEn >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                              ,0x17f,
                              "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
              }
              local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,iVar2);
              local_78 = uVar8 * 2 + 1;
              local_7c = iVar4;
              local_74 = iVar7;
              local_60 = (ulong)uVar5;
              local_58 = (ulong)uVar6;
              local_38 = uVar3;
              iVar2 = sat_solver_addclause(local_50,&local_7c,(lit *)&local_70);
              if (iVar2 == 0) {
                __assert_fail("Cid",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                              ,0x185,
                              "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
              }
              local_78 = uVar8 * 2;
              local_7c = iVar4 + 1;
              local_74 = iVar7;
              iVar2 = sat_solver_addclause(s,&local_7c,(lit *)&local_70);
              if (iVar2 == 0) {
                __assert_fail("Cid",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                              ,0x18b,
                              "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
              }
              uVar3 = (ulong)((int)local_38 + 1);
              iVar7 = iVar7 + 2;
              uVar5 = (int)local_60 + 1;
              iVar4 = iVar4 + 2;
              uVar6 = (int)local_58 + 1;
              iVar2 = (int)local_70 + -1;
              uVar8 = local_44;
            } while (iVar2 != 0);
          }
          local_44 = uVar8;
          local_80 = local_80 + 2;
        } while (local_44 != uVar1);
      }
      iVar2 = sat_solver_simplify(s);
      if (iVar2 == 0) {
        puts("Error: SAT solver became UNSAT at a wrong place.");
      }
      return 1;
    }
  } while( true );
}

Assistant:

int Acb_NtkWindow2Solver( sat_solver * pSat, Cnf_Dat_t * pCnf, Vec_Int_t * vFlip, int PivotVar, int nDivs, int nTimes )
{
    int n, i, RetValue, Test = pCnf->pClauses[0][0];
    int nGroups = nTimes <= 2 ? nTimes-1 : 2;
    int nRounds = nTimes <= 2 ? nTimes-1 : nTimes;
    assert( sat_solver_nvars(pSat) == 0 );
    sat_solver_setnvars( pSat, nTimes * pCnf->nVars + nGroups * nDivs + 2 );
    assert( nTimes == 1 || nTimes == 2 || nTimes == 6 );
    for ( n = 0; n < nTimes; n++ )
    {
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, -pCnf->nVars, vFlip );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, pCnf->nVars, vFlip );
        if ( n < nTimes - 1 )
            Cnf_DataLift( pCnf, pCnf->nVars );
        else if ( n ) // if ( n == nTimes - 1 )
            Cnf_DataLift( pCnf, -(nTimes - 1) * pCnf->nVars );
    }
    assert( Test == pCnf->pClauses[0][0] );
    // add conditional buffers
    for ( n = 0; n < nRounds; n++ )
    {
        int BaseA = n * pCnf->nVars;
        int BaseB = ((n + 1) % nTimes) * pCnf->nVars;
        int BaseC = nTimes * pCnf->nVars + (n & 1) * nDivs;
        for ( i = 0; i < nDivs; i++ )
            sat_solver_add_buffer_enable( pSat, BaseA + i, BaseB + i, BaseC + i, 0 );
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( !RetValue ) printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
    return 1;
}